

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::BooleanBitVectorFunction::BooleanBitVectorFunction
          (BooleanBitVectorFunction *this,KnownSystemName knownNameId,BVFKind kind)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005f0ce8;
  this->kind = kind;
  return;
}

Assistant:

BooleanBitVectorFunction(KnownSystemName knownNameId, BVFKind kind) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), kind(kind) {}